

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O1

int stbtt_FindMatchingFont(uchar *fontdata,char *name,int flags)

{
  bool bVar1;
  uint fontstart;
  int iVar2;
  stbtt_uint32 sVar3;
  size_t sVar4;
  stbtt_int32 i;
  int index;
  stbtt_int32 next_id;
  uint unaff_R12D;
  stbtt_int32 nlen;
  
  index = 0;
  do {
    fontstart = stbtt_GetFontOffsetForIndex(fontdata,index);
    if ((int)fontstart < 0) {
      bVar1 = false;
      unaff_R12D = fontstart;
    }
    else {
      sVar4 = strlen(name);
      iVar2 = stbtt__isfont(fontdata + fontstart);
      bVar1 = true;
      if ((iVar2 != 0) &&
         (((flags == 0 ||
           (sVar3 = stbtt__find_table(fontdata,fontstart,"head"),
           (flags & 7U) == (fontdata[(ulong)sVar3 + 0x2d] & 7))) &&
          (sVar3 = stbtt__find_table(fontdata,fontstart,"name"), sVar3 != 0)))) {
        nlen = (stbtt_int32)sVar4;
        if (flags == 0) {
          iVar2 = stbtt__matchpair(fontdata,sVar3,(stbtt_uint8 *)name,nlen,0x10,0x11);
          if (iVar2 == 0) {
            next_id = 2;
            goto LAB_001386b2;
          }
        }
        else {
          iVar2 = stbtt__matchpair(fontdata,sVar3,(stbtt_uint8 *)name,nlen,0x10,-1);
          if (iVar2 == 0) {
            next_id = -1;
LAB_001386b2:
            iVar2 = stbtt__matchpair(fontdata,sVar3,(stbtt_uint8 *)name,nlen,1,next_id);
            if (iVar2 == 0) {
              iVar2 = stbtt__matchpair(fontdata,sVar3,(stbtt_uint8 *)name,nlen,3,-1);
              if (iVar2 != 0) {
                bVar1 = false;
              }
              goto LAB_001386c7;
            }
          }
        }
        bVar1 = false;
      }
LAB_001386c7:
      if (!bVar1) {
        unaff_R12D = fontstart;
      }
    }
    index = index + 1;
    if (!bVar1) {
      return unaff_R12D;
    }
  } while( true );
}

Assistant:

STBTT_DEF int stbtt_FindMatchingFont(const unsigned char *fontdata, const char *name, int flags)
{
   return stbtt_FindMatchingFont_internal((unsigned char *) fontdata, (char *) name, flags);
}